

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegExpConstructor.cpp
# Opt level: O2

BOOL __thiscall
Js::JavascriptRegExpConstructor::IsEnumerable
          (JavascriptRegExpConstructor *this,PropertyId propertyId)

{
  uint uVar1;
  BOOL BVar2;
  
  uVar1 = propertyId - 0x1d0;
  if ((uVar1 < 0x17) && ((0x78ffffU >> (uVar1 & 0x1f) & 1) != 0)) {
    return *(BOOL *)(&DAT_00fb8838 + (ulong)uVar1 * 4);
  }
  BVar2 = JavascriptFunction::IsEnumerable((JavascriptFunction *)this,propertyId);
  return BVar2;
}

Assistant:

BOOL JavascriptRegExpConstructor::IsEnumerable(PropertyId propertyId)
    {
        switch (propertyId)
        {
        case PropertyIds::input:
        case PropertyIds::$1:
        case PropertyIds::$2:
        case PropertyIds::$3:
        case PropertyIds::$4:
        case PropertyIds::$5:
        case PropertyIds::$6:
        case PropertyIds::$7:
        case PropertyIds::$8:
        case PropertyIds::$9:
        case PropertyIds::leftContext:
        case PropertyIds::rightContext:
        case PropertyIds::lastMatch:
        case PropertyIds::lastParen:
            return true;
        case PropertyIds::$_:
        case PropertyIds::$Ampersand:
        case PropertyIds::$Plus:
        case PropertyIds::$BackTick:
        case PropertyIds::$Tick:
        case PropertyIds::index:
            return false;
        default:
            return JavascriptFunction::IsEnumerable(propertyId);
        }
    }